

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiterable.h
# Opt level: O2

QConstIterator<QMetaAssociation> __thiscall
QIterable<QMetaAssociation>::constEnd(QIterable<QMetaAssociation> *this)

{
  void *pvVar1;
  void *extraout_RDX;
  long in_RSI;
  QConstIterator<QMetaAssociation> QVar2;
  
  pvVar1 = QMetaContainer::constEnd
                     ((QMetaContainer *)(in_RSI + 0x10),
                      (void *)(*(ulong *)(in_RSI + 8) & 0xfffffffffffffffe));
  *(long *)this = in_RSI;
  (this->m_iterable).m_pointer.d = (quintptr)pvVar1;
  QVar2.super_QBaseIterator<QMetaAssociation>.m_iterator = extraout_RDX;
  QVar2.super_QBaseIterator<QMetaAssociation>.m_iterable.m_pointer.d =
       (QTaggedPointer<QIterable<QMetaAssociation>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_>::Tag>
        )(QTaggedPointer<QIterable<QMetaAssociation>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_>::Tag>
          )this;
  return (QConstIterator<QMetaAssociation>)QVar2.super_QBaseIterator<QMetaAssociation>;
}

Assistant:

QConstIterator<Container> constEnd() const
    {
        return QConstIterator(this, m_metaContainer.constEnd(constIterable()));
    }